

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O1

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  uint uVar7;
  long lVar8;
  pointer pSVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  SrcEvaluatorType srcEvaluator;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  SpatialTransform *this;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  SpatialVector Xa;
  Vector3d qdd_temp;
  long local_f8;
  SpatialVector local_d8;
  SpatialVector_t local_a8;
  long local_70;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_68;
  SpatialTransform *local_60;
  Vector3_t local_58;
  long local_40;
  
  lVar12 = (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    uVar13 = (lVar12 >> 4) * 0x6db6db6db6db6db7;
    lVar12 = *(long *)(CS + 0x268);
    lVar18 = *(long *)(CS + 0x280);
    lVar21 = *(long *)(CS + 0x298);
    lVar17 = *(long *)(CS + 0x2e8);
    uVar19 = 1;
    uVar16 = 0;
    do {
      lVar8 = uVar16 * 0x30;
      puVar1 = (undefined8 *)(lVar12 + 0x20 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar12 + 0x10 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar12 + lVar8) = 0;
      ((undefined8 *)(lVar12 + lVar8))[1] = 0;
      puVar1 = (undefined8 *)(lVar18 + 0x20 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar18 + 0x10 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar18 + lVar8) = 0;
      ((undefined8 *)(lVar18 + lVar8))[1] = 0;
      *(undefined8 *)(lVar21 + uVar16 * 8) = 0;
      *(undefined8 *)(lVar17 + 0x10 + uVar16 * 0x18) = 0;
      puVar1 = (undefined8 *)(lVar17 + uVar16 * 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar16 = (ulong)uVar19;
      uVar19 = uVar19 + 1;
    } while (uVar16 <= uVar13 && uVar13 - uVar16 != 0);
  }
  local_68 = f_t;
  if (body_id != 0) {
    uVar13 = (ulong)body_id;
    local_f8 = uVar13 * 0x90;
    lVar12 = uVar13 * 0x30;
    lVar21 = uVar13 * 0x18;
    lVar18 = uVar13 * 0x60;
    local_70 = uVar13 * 0x48;
    lVar17 = 0;
    uVar16 = uVar13;
    do {
      uVar22 = uVar16 - 1;
      if (lVar17 == 0) {
        Math::SpatialTransform::applyAdjoint
                  (&local_d8,
                   (SpatialTransform *)
                   ((long)&(((model->X_base).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar18)
                   ,(local_68->
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar13);
        pdVar14 = (double *)(*(long *)(CS + 0x268) + lVar12);
        *pdVar14 = -local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0];
        pdVar14[1] = -local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[1];
        pdVar14[2] = -local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[2];
        pdVar14[3] = -local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[3];
        pdVar14[4] = -local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[4];
        pdVar14[5] = -local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[5];
      }
      if (*(int *)((long)&((model->mJoints).
                           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           ._M_impl.super__Vector_impl_data._M_start)->mDoFCount + lVar21) == 3) {
        local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->multdof3_S).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + local_f8);
        local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)(*(long *)(CS + 0x268) + lVar12 + lVar17);
        Vector3_t::operator=
                  ((Vector3_t *)(*(long *)(CS + 0x2e8) + lVar21),
                   (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_d8);
        uVar15 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
        if (uVar15 != 0) {
          lVar23 = *(long *)(CS + 0x268);
          local_60 = (SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     lVar18);
          local_58.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] = (double)(lVar12 + lVar17 + lVar23);
          local_58.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1] =
               (double)((long)&(((model->multdof3_U).
                                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 .
                                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                               m_storage + local_f8);
          local_58.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] =
               (double)((long)&(((model->multdof3_Dinv).
                                 super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                                 super__Vector_impl_data._M_start)->super_Matrix3d).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage + local_70);
          local_40 = *(long *)(CS + 0x2e8) + lVar21;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    (&local_a8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&local_58);
          this = local_60;
LAB_00112d51:
          lVar20 = uVar15 * 0x30;
          Math::SpatialTransform::applyTranspose(this,&local_a8);
          lVar8 = *(long *)(CS + 0x268);
          dVar6 = ((double *)(lVar23 + lVar20))[1];
          *(double *)(lVar8 + lVar20) =
               *(double *)(lVar23 + lVar20) +
               local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
          ((double *)(lVar8 + lVar20))[1] =
               dVar6 + local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[1];
          pdVar14 = (double *)(lVar23 + 0x10 + lVar20);
          dVar6 = pdVar14[1];
          pdVar5 = (double *)(lVar8 + 0x10 + lVar20);
          *pdVar5 = *pdVar14 +
                    local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[2];
          pdVar5[1] = dVar6 + local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[3];
          pdVar14 = (double *)(lVar23 + 0x20 + lVar20);
          dVar6 = pdVar14[1];
          pdVar5 = (double *)(lVar8 + 0x20 + lVar20);
          *pdVar5 = *pdVar14 +
                    local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[4];
          pdVar5[1] = dVar6 + local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[5];
        }
      }
      else {
        pSVar9 = (model->S).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar23 = *(long *)(CS + 0x268);
        lVar20 = *(long *)(CS + 0x298);
        lVar8 = lVar23 + lVar12;
        pdVar14 = (double *)
                  ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar17);
        pdVar5 = (double *)
                 ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar17 + 0x10);
        pdVar2 = (double *)
                 ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar17 + 0x20);
        pdVar3 = (double *)(lVar17 + 0x10 + lVar8);
        pdVar4 = (double *)(lVar17 + 0x20 + lVar8);
        *(double *)(lVar20 + 8 + uVar22 * 8) =
             -(pdVar2[1] * pdVar4[1] + pdVar5[1] * pdVar3[1] +
               pdVar14[1] * ((double *)(lVar17 + lVar8))[1] +
              *pdVar2 * *pdVar4 + *pdVar5 * *pdVar3 + *pdVar14 * *(double *)(lVar17 + lVar8));
        uVar15 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
        if (uVar15 != 0) {
          lVar8 = lVar23 + lVar12;
          pSVar9 = (model->U).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar6 = *(double *)(lVar20 + 8 + uVar22 * 8);
          pdVar14 = (double *)
                    ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar17);
          auVar26._0_8_ = *pdVar14 * dVar6;
          auVar26._8_8_ = pdVar14[1] * dVar6;
          dVar24 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[uVar16];
          auVar27._8_8_ = dVar24;
          auVar27._0_8_ = dVar24;
          auVar27 = divpd(auVar26,auVar27);
          local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               auVar27._0_8_ + *(double *)(lVar8 + lVar17);
          local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               auVar27._8_8_ + ((double *)(lVar8 + lVar17))[1];
          pdVar14 = (double *)
                    ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                    lVar17 + 0x10);
          auVar28._0_8_ = *pdVar14 * dVar6;
          auVar28._8_8_ = pdVar14[1] * dVar6;
          auVar10._8_8_ = dVar24;
          auVar10._0_8_ = dVar24;
          auVar27 = divpd(auVar28,auVar10);
          pdVar14 = (double *)(lVar8 + 0x10 + lVar17);
          local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               auVar27._0_8_ + *pdVar14;
          local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               auVar27._8_8_ + pdVar14[1];
          this = (SpatialTransform *)
                 ((long)&(((model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar18);
          pdVar14 = (double *)
                    ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                    lVar17 + 0x20);
          auVar25._0_8_ = dVar6 * *pdVar14;
          auVar25._8_8_ = dVar6 * pdVar14[1];
          auVar11._8_8_ = dVar24;
          auVar11._0_8_ = dVar24;
          auVar27 = divpd(auVar25,auVar11);
          pdVar14 = (double *)(lVar8 + 0x20 + lVar17);
          local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               auVar27._0_8_ + *pdVar14;
          local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               auVar27._8_8_ + pdVar14[1];
          goto LAB_00112d51;
        }
      }
      local_f8 = local_f8 + -0x90;
      lVar17 = lVar17 + -0x30;
      lVar21 = lVar21 + -0x18;
      lVar18 = lVar18 + -0x60;
      local_70 = local_70 + -0x48;
      uVar16 = uVar22;
    } while ((int)uVar22 != 0);
  }
  *(QDDot_t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 0.0;
  pSVar9 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = *(undefined8 **)(CS + 0x280);
  dVar6 = *(double *)
           ((long)&(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
  *puVar1 = *(undefined8 *)
             &(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
  puVar1[1] = dVar6;
  dVar6 = *(double *)
           ((long)&(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  puVar1[2] = *(double *)
               ((long)&(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
  puVar1[3] = dVar6;
  dVar6 = *(double *)
           ((long)&(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
  puVar1[4] = *(double *)
               ((long)&(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
  puVar1[5] = dVar6;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar13 = 1;
    uVar19 = 2;
    do {
      uVar7 = (model->mJoints).
              super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              .
              super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13].q_index;
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar13,
                 (SpatialVector *)
                 ((ulong)(model->lambda).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13] * 0x30 + *(long *)(CS + 0x280)));
      if ((model->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar13].mDoFCount == 3) {
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar13);
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)(uVar13 * 0x18 + *(long *)(CS + 0x2e8));
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)((model->multdof3_U).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             (double)&local_d8;
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  (&local_58,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)&local_a8);
        pdVar14 = (QDDot_t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        pdVar14[uVar7] =
             local_58.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        pdVar14[uVar7 + 1] =
             local_58.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
        pdVar14[uVar7 + 2] =
             local_58.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)&local_58;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)
                   local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                             *)&local_a8);
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)&local_d8;
        local_a8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)&local_58;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)(uVar13 * 0x30 + *(long *)(CS + 0x280)),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&local_a8);
      }
      else {
        lVar18 = uVar13 * 0x30;
        pSVar9 = (model->U).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)
                  ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar5 = (double *)
                 ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar24 = (*(double *)(*(long *)(CS + 0x298) + uVar13 * 8) -
                 (pdVar5[1] *
                  local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] +
                  pdVar14[1] *
                  local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] +
                  *(double *)
                   ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                  local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                 *pdVar5 * local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[4] +
                 *pdVar14 *
                 local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2] + *(double *)
                        &pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                       local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[0])) /
                 (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data[uVar13];
        (QDDot_t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar7] = dVar24;
        pSVar9 = (model->S).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)(CS + 0x280);
        dVar6 = *(double *)
                 ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)(lVar12 + lVar18) =
             *(double *)
              &pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar24 +
             local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
        ((double *)(lVar12 + lVar18))[1] =
             dVar6 * dVar24 +
             local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
        pdVar14 = (double *)
                  ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar6 = pdVar14[1];
        pdVar5 = (double *)(lVar12 + 0x10 + lVar18);
        *pdVar5 = *pdVar14 * dVar24 +
                  local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
        pdVar5[1] = dVar6 * dVar24 +
                    local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3];
        pdVar14 = (double *)
                  ((long)&pSVar9[uVar13].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar6 = pdVar14[1];
        pdVar5 = (double *)(lVar12 + 0x20 + lVar18);
        *pdVar5 = dVar24 * *pdVar14 +
                  local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4];
        pdVar5[1] = dVar24 * dVar6 +
                    local_d8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5];
      }
      uVar13 = (ulong)uVar19;
      uVar16 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar19 = uVar19 + 1;
    } while (uVar13 <= uVar16 && uVar16 - uVar13 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
		Model &model,
		ConstraintSet &CS,
		VectorNd &QDDot_t,
		const unsigned int body_id,
		const std::vector<SpatialVector> &f_t
		) {
	LOG << "-------- " << __func__ << " ------" << std::endl;

	assert (CS.d_pA.size() == model.mBodies.size());
	assert (CS.d_a.size() == model.mBodies.size());
	assert (CS.d_u.size() == model.mBodies.size());

	// TODO reset all values (debug)
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		CS.d_pA[i].setZero();
		CS.d_a[i].setZero();
		CS.d_u[i] = 0.;
		CS.d_multdof3_u[i].setZero();
	}

	for (unsigned int i = body_id; i > 0; i--) {
		if (i == body_id) {
			CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
		}

		if (model.mJoints[i].mDoFCount == 3) {
			CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * CS.d_multdof3_u[i]);
			}
		} else {
			CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
			}
		}
	}

	for (unsigned int i = 0; i < f_t.size(); i++) {
		LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
	}

	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
	}
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
	}

	QDDot_t[0] = 0.;
	CS.d_a[0] = model.a[0];

	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];

		SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);
			QDDot_t[q_index] = qdd_temp[0];
			QDDot_t[q_index + 1] = qdd_temp[1];
			QDDot_t[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
			CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
			CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
		}
	
		LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
		LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
	}
}